

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O3

Torsion * __thiscall OpenMD::SelectionManager::nextUnselectedTorsion(SelectionManager *this,int *i)

{
  int iVar1;
  Torsion *pTVar2;
  
  iVar1 = OpenMDBitSet::nextOffBit
                    ((this->ss_).bitsets_.
                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                     ._M_impl.super__Vector_impl_data._M_start + 3,*i);
  *i = iVar1;
  if (iVar1 == -1) {
    pTVar2 = (Torsion *)0x0;
  }
  else {
    pTVar2 = (this->torsions_).
             super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
             super__Vector_impl_data._M_start[iVar1];
  }
  return pTVar2;
}

Assistant:

Torsion* SelectionManager::nextUnselectedTorsion(int& i) {
#ifdef IS_MPI
    ++i;
    while (i < static_cast<int>(ss_.bitsets_[TORSION].size())) {
      if (!ss_.bitsets_[TORSION][i]) {
        // check that this processor owns this torsion
        if (torsions_[i] != NULL) return torsions_[i];
      }
      ++i;
    }
    return NULL;
#else
    i = ss_.bitsets_[TORSION].nextOffBit(i);
    return i == -1 ? NULL : torsions_[i];
#endif
  }